

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate
          (cmLinkedTree<cmStateDetail::SnapshotDataType> *this)

{
  bool bVar1;
  __normal_iterator<cmStateDetail::SnapshotDataType_*,_std::vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>_>
  local_78;
  const_iterator local_70;
  __normal_iterator<cmStateDetail::SnapshotDataType_*,_std::vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>_>
  local_68;
  __normal_iterator<cmStateDetail::SnapshotDataType_*,_std::vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>_>
  local_60;
  const_iterator local_58;
  unsigned_long *local_50;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  const_iterator local_40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  const_iterator local_28;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_20;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *this_local;
  
  local_20 = this;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->UpPositions);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->UpPositions.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLinkedTree.h"
                  ,0x9f,
                  "iterator cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate() [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  local_38._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->UpPositions);
  local_30 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator+(&local_38,1);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_28,&local_30);
  local_48._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->UpPositions);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_40,&local_48);
  local_50 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                       (&this->UpPositions,local_28,local_40);
  bVar1 = std::
          vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
          ::empty(&this->Data);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->Data.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLinkedTree.h"
                  ,0xa2,
                  "iterator cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate() [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  local_68._M_current =
       (SnapshotDataType *)
       std::
       vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>::
       begin(&this->Data);
  local_60 = __gnu_cxx::
             __normal_iterator<cmStateDetail::SnapshotDataType_*,_std::vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>_>
             ::operator+(&local_68,1);
  __gnu_cxx::
  __normal_iterator<cmStateDetail::SnapshotDataType_const*,std::vector<cmStateDetail::SnapshotDataType,std::allocator<cmStateDetail::SnapshotDataType>>>
  ::__normal_iterator<cmStateDetail::SnapshotDataType*>
            ((__normal_iterator<cmStateDetail::SnapshotDataType_const*,std::vector<cmStateDetail::SnapshotDataType,std::allocator<cmStateDetail::SnapshotDataType>>>
              *)&local_58,&local_60);
  local_78._M_current =
       (SnapshotDataType *)
       std::
       vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>::
       end(&this->Data);
  __gnu_cxx::
  __normal_iterator<cmStateDetail::SnapshotDataType_const*,std::vector<cmStateDetail::SnapshotDataType,std::allocator<cmStateDetail::SnapshotDataType>>>
  ::__normal_iterator<cmStateDetail::SnapshotDataType*>
            ((__normal_iterator<cmStateDetail::SnapshotDataType_const*,std::vector<cmStateDetail::SnapshotDataType,std::allocator<cmStateDetail::SnapshotDataType>>>
              *)&local_70,&local_78);
  std::vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>::
  erase(&this->Data,local_58,local_70);
  iterator::iterator((iterator *)&this_local,this,1);
  return _this_local;
}

Assistant:

iterator Truncate()
  {
    assert(!this->UpPositions.empty());
    this->UpPositions.erase(this->UpPositions.begin() + 1,
                            this->UpPositions.end());
    assert(!this->Data.empty());
    this->Data.erase(this->Data.begin() + 1, this->Data.end());
    return iterator(this, 1);
  }